

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

string * llvm::sys::getProcessTriple_abi_cxx11_(void)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  string *in_RDI;
  StringRef Str;
  Triple local_120;
  Triple *local_e8;
  string local_d8;
  Twine local_b8;
  undefined1 local_a0 [8];
  Triple PT;
  string local_60;
  undefined1 local_40 [8];
  string TargetTripleString;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"",(allocator *)((long)&PT.ObjectFormat + 3));
  updateTripleOSVersion((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&PT.ObjectFormat + 3));
  local_e8 = (Triple *)std::__cxx11::string::data();
  pcVar2 = (char *)std::__cxx11::string::length();
  Str.Length = (size_t)pcVar2;
  Str.Data = pcVar2;
  Triple::normalize_abi_cxx11_(&local_d8,local_e8,Str);
  Twine::Twine(&local_b8,&local_d8);
  Triple::Triple((Triple *)local_a0,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = Triple::isArch32Bit((Triple *)local_a0);
  if (bVar1) {
    Triple::get64BitArchVariant(&local_120,(Triple *)local_a0);
    Triple::operator=((Triple *)local_a0,&local_120);
    Triple::~Triple(&local_120);
  }
  psVar3 = Triple::str_abi_cxx11_((Triple *)local_a0);
  std::__cxx11::string::string((string *)in_RDI,(string *)psVar3);
  Triple::~Triple((Triple *)local_a0);
  std::__cxx11::string::~string((string *)local_40);
  return in_RDI;
}

Assistant:

std::string sys::getProcessTriple() {
  std::string TargetTripleString = updateTripleOSVersion(LLVM_HOST_TRIPLE);
  Triple PT(Triple::normalize(TargetTripleString));

  if (sizeof(void *) == 8 && PT.isArch32Bit())
    PT = PT.get64BitArchVariant();
  if (sizeof(void *) == 4 && PT.isArch64Bit())
    PT = PT.get32BitArchVariant();

  return PT.str();
}